

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

void __thiscall cmCTest::SetCTestConfiguration(cmCTest *this,char *name,char *value,bool suppress)

{
  size_t sVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar4;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_1c8 [8];
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"SetCTestConfiguration:",0x16);
  if (name == (char *)0x0) {
    std::ios::clear((int)(auStack_1c8 + (long)*(_func_int **)(local_1a0._0_8_ + -0x18)) + 0x28);
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
  pcVar3 = "(null)";
  if (value != (char *)0x0) {
    pcVar3 = value;
  }
  sVar1 = strlen(pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0xa39,(char *)local_1c0,suppress);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  if (name != (char *)0x0) {
    if (value == (char *)0x0) {
      local_1a0._0_8_ = local_1a0 + 0x10;
      sVar1 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,name,name + sVar1);
      pVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::equal_range(&(this->CTestConfiguration)._M_t,(key_type *)local_1a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&(this->CTestConfiguration)._M_t,(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
      if ((undefined1 *)local_1a0._0_8_ == local_1a0 + 0x10) {
        return;
      }
    }
    else {
      local_1a0._0_8_ = local_1a0 + 0x10;
      sVar1 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,name,name + sVar1);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->CTestConfiguration,(key_type *)local_1a0);
      pcVar3 = (char *)pmVar2->_M_string_length;
      strlen(value);
      std::__cxx11::string::_M_replace((ulong)pmVar2,0,pcVar3,(ulong)value);
      if ((undefined1 *)local_1a0._0_8_ == local_1a0 + 0x10) {
        return;
      }
    }
    operator_delete((void *)local_1a0._0_8_,local_190[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTest::SetCTestConfiguration(const char* name, const char* value,
                                    bool suppress)
{
  cmCTestOptionalLog(this, HANDLER_VERBOSE_OUTPUT,
                     "SetCTestConfiguration:"
                       << name << ":" << (value ? value : "(null)") << "\n",
                     suppress);

  if (!name) {
    return;
  }
  if (!value) {
    this->CTestConfiguration.erase(name);
    return;
  }
  this->CTestConfiguration[name] = value;
}